

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monomorphize.cpp
# Opt level: O2

Pass * wasm::createMonomorphizePass(void)

{
  Monomorphize *this;
  
  this = (Monomorphize *)operator_new(0x98);
  anon_unknown_0::Monomorphize::Monomorphize(this,true);
  return &this->super_Pass;
}

Assistant:

Pass* createMonomorphizePass() { return new Monomorphize(true); }